

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O3

void LoadTriangles(Level *NewLev,int radius)

{
  Edge *pEVar1;
  long lVar2;
  int iVar3;
  Triangle *t;
  Edge *pEVar4;
  Material *pMVar5;
  long lVar6;
  bool bVar7;
  
  ExpectToken(TK_OPENBRACE);
  do {
    GetToken();
    if (Token.Type != TK_OPENBRACE) {
      if (Token.Type != TK_CLOSEBRACE) {
        Error = 1;
      }
      return;
    }
    t = NewTriangle();
    GetVert(NewLev,t,0);
    ExpectToken(TK_COMMA);
    GetVert(NewLev,t,1);
    ExpectToken(TK_COMMA);
    GetVert(NewLev,t,2);
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    iVar3 = Token.IQuantity;
    pMVar5 = NewLev->AllMats;
    t->Material = pMVar5;
    if (pMVar5 == (Material *)0x0) {
      if (iVar3 != -1) {
LAB_0010d717:
        Error = 1;
        snprintf(ErrorText,0x400,"Unknown material referenced at line %d",(ulong)(uint)Lines);
        return;
      }
    }
    else {
      while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
        pMVar5 = pMVar5->Next;
        t->Material = pMVar5;
        Token.IQuantity = iVar3;
        if (pMVar5 == (Material *)0x0) goto LAB_0010d717;
      }
      Token.IQuantity = -1;
    }
    ExpectToken(TK_CLOSEBRACE);
    t->Next = NewLev->AllTris;
    NewLev->AllTris = t;
    lVar6 = 0;
    do {
      if ((*(byte *)((long)t->EdgeFlags + lVar6 * 4 + 9) & 1) != 0) {
        pEVar1 = NewLev->AllEdges;
        pEVar4 = NewEdge();
        NewLev->AllEdges = pEVar4;
        pEVar4->Material = t->Material;
        pEVar4->Next = pEVar1;
        lVar2 = lVar6 + 3;
        if ((int)lVar6 == 0) {
          lVar2 = lVar6;
        }
        pEVar4->EndPoints[0] = t->Edges[lVar6 + 2];
        NewLev->AllEdges->EndPoints[1] = t->Edges[(int)lVar2];
        pEVar1 = NewLev->AllEdges;
        GetNormal(pEVar1,pEVar1->EndPoints[0]->Pos,pEVar1->EndPoints[1]->Pos);
        pEVar1->c = (pEVar1->a * pEVar1->a + pEVar1->b * pEVar1->b) * -(double)radius + pEVar1->c;
        pEVar1->EndPoints[0]->Edges[pEVar1->EndPoints[0]->Edges[0] != (Edge *)0x0] = pEVar1;
        pEVar1->EndPoints[1]->Edges[pEVar1->EndPoints[1]->Edges[0] != (Edge *)0x0] = pEVar1;
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != -3);
  } while( true );
}

Assistant:

void LoadTriangles(struct Level *NewLev, int radius)
{
   struct Triangle *Tri;
   struct Edge *NextEdge;
   int c;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               Tri = NewTriangle();

               /* read vertex pointers & edge flags */
               GetVert(NewLev, Tri, 0);
               ExpectToken(TK_COMMA);
               GetVert(NewLev, Tri, 1);
               ExpectToken(TK_COMMA);
               GetVert(NewLev, Tri, 2);
               ExpectToken(TK_COMMA);

               /* read material reference and store correct pointer */
               ExpectToken(TK_NUMBER);

               Tri->Material = NewLev->AllMats;
               while (Tri->Material && Token.IQuantity--)
                  Tri->Material = Tri->Material->Next;
               if (Token.IQuantity != -1) {
                  Error = 1;
                  snprintf(ErrorText, sizeof(ErrorText),
                            "Unknown material referenced at line %d", Lines);
                  return;
               }

               /* expect end of this triangle */
               ExpectToken(TK_CLOSEBRACE);

               /* insert new triangle into total level list */
               Tri->Next = NewLev->AllTris;
               NewLev->AllTris = Tri;

               /* generate edges */
               c = 3;
               while (c--) {
                  if (Tri->EdgeFlags[c] & FLAGS_COLLIDABLE) {
                     NextEdge = NewLev->AllEdges;
                     NewLev->AllEdges = NewEdge();
                     NewLev->AllEdges->Material = Tri->Material;
                     NewLev->AllEdges->Next = NextEdge;

                     NewLev->AllEdges->EndPoints[0] = Tri->Edges[c];
                     NewLev->AllEdges->EndPoints[1] = Tri->Edges[(c + 1) % 3];

                     InitEdge(NewLev->AllEdges, radius);
                  }
               }
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}